

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::WhileStmt::~WhileStmt(WhileStmt *this)

{
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__WhileStmt_00122650;
  if (this->condition != (BooleanExpr *)0x0) {
    (*(this->condition->super_Expr).super_Node._vptr_Node[1])();
  }
  this->condition = (BooleanExpr *)0x0;
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~WhileStmt(){
       delete condition;
       condition = nullptr;
       delete body;
       body = nullptr;
    }